

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.h
# Opt level: O3

void __thiscall
chrono::utils::CSV_writer::write_to_file(CSV_writer *this,string *filename,string *header)

{
  ofstream ofile;
  long *local_238;
  long local_230;
  long local_228 [2];
  long local_218;
  filebuf local_210 [240];
  ios_base local_120 [264];
  
  std::ofstream::ofstream((ostream *)&local_218,(filename->_M_dataplus)._M_p,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,(header->_M_dataplus)._M_p,header->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,(char *)local_238,local_230);
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  std::ofstream::close();
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = __M_insert<long>;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void write_to_file(const std::string& filename, const std::string& header = "") const {
        std::ofstream ofile(filename.c_str());
        ofile << header;
        ofile << m_ss.str();
        ofile.close();
    }